

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

int isinsets(re_guts *g,int c)

{
  uint uc;
  int ncols;
  int i;
  uch *col;
  int c_local;
  re_guts *g_local;
  
  uc = 0;
  _ncols = g->setbits;
  while( true ) {
    if ((g->ncsets + 7) / 8 <= (int)uc) {
      return 0;
    }
    if (_ncols[c & 0xff] != '\0') break;
    uc = uc + 1;
    _ncols = _ncols + g->csetsize;
  }
  return 1;
}

Assistant:

static int			/* predicate */
isinsets(g, c)
struct re_guts *g;
int c;
{
	uch *col;
	int i;
	int ncols = (g->ncsets+(CHAR_BIT-1)) / CHAR_BIT;
	unsigned uc = (unsigned char)c;

	for (i = 0, col = g->setbits; i < ncols; i++, col += g->csetsize)
		if (col[uc] != 0)
			return(1);
	return(0);
}